

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_done(connectdata *conn,CURLcode status,_Bool premature)

{
  char cVar1;
  curl_ftpfile cVar2;
  Curl_easy *data;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  CURLcode CVar8;
  CURLcode CVar9;
  size_t sVar10;
  size_t sVar11;
  char *pcVar12;
  curl_slist *item;
  curl_slist *pcVar13;
  void *pvVar14;
  curltime cVar15;
  int ftpcode;
  int ftpcode_1;
  ftp_conn *ftpc;
  char *path;
  ssize_t nread;
  ssize_t nread_1;
  int local_58;
  int local_54;
  pingpong *local_50;
  char *local_48;
  long local_40;
  ssize_t local_38;
  
  data = conn->data;
  pvVar3 = (data->req).protop;
  local_48 = (char *)0x0;
  if (pvVar3 == (void *)0x0) {
    return CURLE_OK;
  }
  if ((((CURLE_FILESIZE_EXCEEDED < status) ||
       ((0x80000010428e3601U >> ((ulong)status & 0x3f) & 1) == 0)) &&
      (status != CURLE_REMOTE_FILE_NOT_FOUND)) || (CVar8 = CURLE_OK, premature)) {
    (conn->proto).ftpc.ctl_valid = false;
    (conn->proto).ftpc.cwdfail = true;
    Curl_conncontrol(conn,1);
    CVar8 = status;
  }
  (*Curl_cfree)((conn->proto).ftpc.prevpath);
  if (((data->state).field_0x4e4 & 0x80) != 0) {
    if (((data->set).chunk_end != (curl_chunk_end_callback)0x0) &&
       ((conn->proto).ftpc.file != (char *)0x0)) {
      Curl_set_in_callback(data,true);
      (*(data->set).chunk_end)((data->wildcard).customptr);
      Curl_set_in_callback(data,false);
    }
    (conn->proto).ftpc.known_filesize = -1;
  }
  if (CVar8 == CURLE_OK) {
    CVar8 = Curl_urldecode(data,*(char **)((long)pvVar3 + 0x10),0,&local_48,(size_t *)0x0,true);
  }
  if (CVar8 == CURLE_OK) {
    pcVar12 = (conn->proto).ftpc.file;
    if (pcVar12 == (char *)0x0) {
      sVar10 = 0;
    }
    else {
      sVar10 = strlen(pcVar12);
    }
    pcVar12 = local_48;
    sVar11 = strlen(local_48);
    if ((conn->proto).ftpc.cwdfail == false) {
      cVar2 = (data->set).ftp_filemethod;
      (conn->proto).ftpc.prevmethod = cVar2;
      if (cVar2 == FTPFILE_NOCWD || sVar11 == sVar10) {
        (*Curl_cfree)(pcVar12);
        pcVar12 = (*Curl_cstrdup)("");
        (conn->proto).ftpc.prevpath = pcVar12;
        if (pcVar12 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
      }
      else {
        (conn->proto).ftpc.prevpath = pcVar12;
        if (sVar10 != 0) {
          pcVar12[sVar11 - sVar10] = '\0';
        }
      }
      if ((conn->proto).ftpc.prevpath != (char *)0x0) {
        Curl_infof(data,"Remembering we are in dir \"%s\"\n");
      }
    }
    else {
      (conn->proto).ftpc.prevpath = (char *)0x0;
      (*Curl_cfree)(pcVar12);
    }
  }
  else {
    (conn->proto).ftpc.ctl_valid = false;
    Curl_conncontrol(conn,1);
    (conn->proto).ftpc.prevpath = (char *)0x0;
  }
  local_50 = (pingpong *)&conn->proto;
  freedirs((ftp_conn *)local_50);
  if (conn->sock[1] != -1) {
    if (((CVar8 == CURLE_OK) && (CVar8 = CURLE_OK, (conn->proto).ftpc.dont_check == true)) &&
       (0 < (data->req).maxdownload)) {
      CVar9 = Curl_pp_sendf(local_50,"%s","ABOR");
      CVar8 = CURLE_OK;
      if (CVar9 != CURLE_OK) {
        pcVar12 = curl_easy_strerror(CVar9);
        Curl_failf(data,"Failure sending ABOR command: %s",pcVar12);
        (conn->proto).ftpc.ctl_valid = false;
        Curl_conncontrol(conn,1);
        CVar8 = CVar9;
      }
    }
    if ((conn->ssl[1].field_0x10 & 1) != 0) {
      Curl_ssl_close(conn,1);
    }
    if (conn->sock[1] != -1) {
      Curl_closesocket(conn,conn->sock[1]);
      conn->sock[1] = -1;
    }
    (conn->bits).tcpconnect[1] = false;
  }
  if (CVar8 == CURLE_OK) {
    CVar8 = CURLE_OK;
    if (((*(int *)((long)pvVar3 + 0x20) == 0) && ((conn->proto).ftpc.ctl_valid == true)) &&
       (CVar8 = CURLE_OK, (conn->proto).sshc.authed == true && !premature)) {
      lVar4 = (conn->proto).ftpc.pp.response_time;
      (conn->proto).ftpc.pp.response_time = 60000;
      cVar15 = Curl_now();
      (conn->proto).smbc.send_size = cVar15.tv_sec;
      *(int *)((long)&conn->proto + 0x48) = cVar15.tv_usec;
      CVar8 = Curl_GetFTPResponse(&local_40,conn,&local_58);
      (conn->proto).ftpc.pp.response_time = lVar4;
      if (CVar8 == CURLE_OPERATION_TIMEDOUT && local_40 == 0) {
        Curl_failf(data,"control connection looks dead");
        (conn->proto).ftpc.ctl_valid = false;
        Curl_conncontrol(conn,1);
      }
      if (CVar8 == CURLE_OK) {
        if ((conn->proto).ftpc.dont_check == true) {
          if ((data->req).maxdownload < 1) {
            CVar9 = CURLE_OUT_OF_MEMORY;
            CVar8 = CURLE_OK;
            bVar7 = true;
          }
          else {
            bVar7 = false;
            Curl_infof(data,"partial download completed, closing connection\n");
            Curl_conncontrol(conn,1);
            CVar8 = CURLE_OK;
            CVar9 = CURLE_OK;
          }
        }
        else {
          CVar9 = CURLE_OUT_OF_MEMORY;
          CVar8 = CURLE_OK;
          bVar7 = true;
          if ((local_58 != 0xe2) && (local_58 != 0xfa)) {
            Curl_failf(data,"server did not report OK, got %d");
            CVar8 = CURLE_PARTIAL_FILE;
          }
        }
      }
      else {
        bVar7 = false;
        CVar9 = CVar8;
      }
      if (!bVar7) {
        return CVar9;
      }
    }
  }
  if (CVar8 == CURLE_OK && !premature) {
    uVar5 = *(ulong *)&(data->set).field_0x878;
    if (((uint)uVar5 >> 0x1d & 1) == 0) {
      lVar4 = (data->req).size;
      if ((((lVar4 == -1) || (lVar6 = (data->req).bytecount, lVar4 == lVar6)) ||
          ((data->state).crlf_conversions + lVar4 == lVar6)) || ((data->req).maxdownload == lVar6))
      {
        CVar8 = CURLE_OK;
        if ((((conn->proto).ftpc.dont_check == false) && (0 < lVar4)) &&
           (CVar8 = CURLE_OK, (data->req).bytecount == 0)) {
          Curl_failf(data,"No data was received!");
          CVar8 = CURLE_FTP_COULDNT_RETR_FILE;
        }
        goto LAB_004d8524;
      }
      Curl_failf(data,"Received only partial file: %ld bytes");
    }
    else {
      lVar4 = (data->state).infilesize;
      CVar8 = CURLE_OK;
      if (((lVar4 == -1) || ((uVar5 & 0x40) != 0)) ||
         ((lVar4 == (data->req).writebytecount || (*(int *)((long)pvVar3 + 0x20) != 0))))
      goto LAB_004d8524;
      Curl_failf(data,"Uploaded unaligned file size (%ld out of %ld bytes)",(data->req).bytecount);
    }
    CVar8 = CURLE_PARTIAL_FILE;
  }
LAB_004d8524:
  *(undefined4 *)((long)pvVar3 + 0x20) = 0;
  (conn->proto).ftpc.dont_check = false;
  if ((status == CURLE_OK && CVar8 == CURLE_OK) && !premature) {
    pcVar13 = (data->set).postquote;
    pvVar14 = pvVar3;
    if (pcVar13 == (curl_slist *)0x0) {
      CVar8 = CURLE_OK;
    }
    else {
      do {
        pcVar12 = pcVar13->data;
        if (pcVar12 != (char *)0x0) {
          cVar1 = *pcVar12;
          bVar7 = false;
          CVar8 = Curl_pp_sendf(local_50,"%s",pcVar12 + (cVar1 == '*'));
          if (CVar8 == CURLE_OK) {
            cVar15 = Curl_now();
            (conn->proto).smbc.send_size = cVar15.tv_sec;
            *(int *)((long)&conn->proto + 0x48) = cVar15.tv_usec;
            CVar8 = Curl_GetFTPResponse(&local_38,conn,&local_54);
            if (CVar8 == CURLE_OK) {
              bVar7 = true;
              CVar8 = (CURLcode)pvVar14;
              if ((cVar1 != '*') && (399 < local_54)) {
                bVar7 = false;
                Curl_failf(conn->data,"QUOT string not accepted: %s",pcVar12 + (cVar1 == '*'));
                CVar8 = CURLE_QUOTE_ERROR;
              }
            }
            else {
              bVar7 = false;
            }
          }
          pvVar14 = (void *)(ulong)CVar8;
          if (!bVar7) goto LAB_004d86fd;
        }
        pcVar13 = pcVar13->next;
      } while (pcVar13 != (curl_slist *)0x0);
      CVar8 = CURLE_OK;
    }
  }
LAB_004d86fd:
  (*Curl_cfree)(*(void **)((long)pvVar3 + 0x18));
  *(undefined8 *)((long)pvVar3 + 0x18) = 0;
  return CVar8;
}

Assistant:

static CURLcode ftp_done(struct connectdata *conn, CURLcode status,
                         bool premature)
{
  struct Curl_easy *data = conn->data;
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  ssize_t nread;
  int ftpcode;
  CURLcode result = CURLE_OK;
  char *path = NULL;

  if(!ftp)
    return CURLE_OK;

  switch(status) {
  case CURLE_BAD_DOWNLOAD_RESUME:
  case CURLE_FTP_WEIRD_PASV_REPLY:
  case CURLE_FTP_PORT_FAILED:
  case CURLE_FTP_ACCEPT_FAILED:
  case CURLE_FTP_ACCEPT_TIMEOUT:
  case CURLE_FTP_COULDNT_SET_TYPE:
  case CURLE_FTP_COULDNT_RETR_FILE:
  case CURLE_PARTIAL_FILE:
  case CURLE_UPLOAD_FAILED:
  case CURLE_REMOTE_ACCESS_DENIED:
  case CURLE_FILESIZE_EXCEEDED:
  case CURLE_REMOTE_FILE_NOT_FOUND:
  case CURLE_WRITE_ERROR:
    /* the connection stays alive fine even though this happened */
    /* fall-through */
  case CURLE_OK: /* doesn't affect the control connection's status */
    if(!premature)
      break;

    /* until we cope better with prematurely ended requests, let them
     * fallback as if in complete failure */
    /* FALLTHROUGH */
  default:       /* by default, an error means the control connection is
                    wedged and should not be used anymore */
    ftpc->ctl_valid = FALSE;
    ftpc->cwdfail = TRUE; /* set this TRUE to prevent us to remember the
                             current path, as this connection is going */
    connclose(conn, "FTP ended with bad error code");
    result = status;      /* use the already set error code */
    break;
  }

  /* now store a copy of the directory we are in */
  free(ftpc->prevpath);

  if(data->state.wildcardmatch) {
    if(data->set.chunk_end && ftpc->file) {
      Curl_set_in_callback(data, true);
      data->set.chunk_end(data->wildcard.customptr);
      Curl_set_in_callback(data, false);
    }
    ftpc->known_filesize = -1;
  }

  if(!result)
    /* get the "raw" path */
    result = Curl_urldecode(data, ftp->path, 0, &path, NULL, TRUE);
  if(result) {
    /* We can limp along anyway (and should try to since we may already be in
     * the error path) */
    ftpc->ctl_valid = FALSE; /* mark control connection as bad */
    connclose(conn, "FTP: out of memory!"); /* mark for connection closure */
    ftpc->prevpath = NULL; /* no path remembering */
  }
  else {
    size_t flen = ftpc->file?strlen(ftpc->file):0; /* file is "raw" already */
    size_t dlen = strlen(path)-flen;
    if(!ftpc->cwdfail) {
      ftpc->prevmethod = data->set.ftp_filemethod;
      if(dlen && (data->set.ftp_filemethod != FTPFILE_NOCWD)) {
        ftpc->prevpath = path;
        if(flen)
          /* if 'path' is not the whole string */
          ftpc->prevpath[dlen] = 0; /* terminate */
      }
      else {
        free(path);
        /* we never changed dir */
        ftpc->prevpath = strdup("");
        if(!ftpc->prevpath)
          return CURLE_OUT_OF_MEMORY;
      }
      if(ftpc->prevpath)
        infof(data, "Remembering we are in dir \"%s\"\n", ftpc->prevpath);
    }
    else {
      ftpc->prevpath = NULL; /* no path */
      free(path);
    }
  }
  /* free the dir tree and file parts */
  freedirs(ftpc);

  /* shut down the socket to inform the server we're done */

#ifdef _WIN32_WCE
  shutdown(conn->sock[SECONDARYSOCKET], 2);  /* SD_BOTH */
#endif

  if(conn->sock[SECONDARYSOCKET] != CURL_SOCKET_BAD) {
    if(!result && ftpc->dont_check && data->req.maxdownload > 0) {
      /* partial download completed */
      result = Curl_pp_sendf(pp, "%s", "ABOR");
      if(result) {
        failf(data, "Failure sending ABOR command: %s",
              curl_easy_strerror(result));
        ftpc->ctl_valid = FALSE; /* mark control connection as bad */
        connclose(conn, "ABOR command failed"); /* connection closure */
      }
    }

    if(conn->ssl[SECONDARYSOCKET].use) {
      /* The secondary socket is using SSL so we must close down that part
         first before we close the socket for real */
      Curl_ssl_close(conn, SECONDARYSOCKET);

      /* Note that we keep "use" set to TRUE since that (next) connection is
         still requested to use SSL */
    }
    close_secondarysocket(conn);
  }

  if(!result && (ftp->transfer == FTPTRANSFER_BODY) && ftpc->ctl_valid &&
     pp->pending_resp && !premature) {
    /*
     * Let's see what the server says about the transfer we just performed,
     * but lower the timeout as sometimes this connection has died while the
     * data has been transferred. This happens when doing through NATs etc that
     * abandon old silent connections.
     */
    long old_time = pp->response_time;

    pp->response_time = 60*1000; /* give it only a minute for now */
    pp->response = Curl_now(); /* timeout relative now */

    result = Curl_GetFTPResponse(&nread, conn, &ftpcode);

    pp->response_time = old_time; /* set this back to previous value */

    if(!nread && (CURLE_OPERATION_TIMEDOUT == result)) {
      failf(data, "control connection looks dead");
      ftpc->ctl_valid = FALSE; /* mark control connection as bad */
      connclose(conn, "Timeout or similar in FTP DONE operation"); /* close */
    }

    if(result)
      return result;

    if(ftpc->dont_check && data->req.maxdownload > 0) {
      /* we have just sent ABOR and there is no reliable way to check if it was
       * successful or not; we have to close the connection now */
      infof(data, "partial download completed, closing connection\n");
      connclose(conn, "Partial download with no ability to check");
      return result;
    }

    if(!ftpc->dont_check) {
      /* 226 Transfer complete, 250 Requested file action okay, completed. */
      if((ftpcode != 226) && (ftpcode != 250)) {
        failf(data, "server did not report OK, got %d", ftpcode);
        result = CURLE_PARTIAL_FILE;
      }
    }
  }

  if(result || premature)
    /* the response code from the transfer showed an error already so no
       use checking further */
    ;
  else if(data->set.upload) {
    if((-1 != data->state.infilesize) &&
       (data->state.infilesize != data->req.writebytecount) &&
       !data->set.crlf &&
       (ftp->transfer == FTPTRANSFER_BODY)) {
      failf(data, "Uploaded unaligned file size (%" CURL_FORMAT_CURL_OFF_T
            " out of %" CURL_FORMAT_CURL_OFF_T " bytes)",
            data->req.bytecount, data->state.infilesize);
      result = CURLE_PARTIAL_FILE;
    }
  }
  else {
    if((-1 != data->req.size) &&
       (data->req.size != data->req.bytecount) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs, so
        * we'll check to see if the discrepancy can be explained by the number
        * of CRLFs we've changed to LFs.
        */
       ((data->req.size + data->state.crlf_conversions) !=
        data->req.bytecount) &&
#endif /* CURL_DO_LINEEND_CONV */
       (data->req.maxdownload != data->req.bytecount)) {
      failf(data, "Received only partial file: %" CURL_FORMAT_CURL_OFF_T
            " bytes", data->req.bytecount);
      result = CURLE_PARTIAL_FILE;
    }
    else if(!ftpc->dont_check &&
            !data->req.bytecount &&
            (data->req.size>0)) {
      failf(data, "No data was received!");
      result = CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  /* clear these for next connection */
  ftp->transfer = FTPTRANSFER_BODY;
  ftpc->dont_check = FALSE;

  /* Send any post-transfer QUOTE strings? */
  if(!status && !result && !premature && data->set.postquote)
    result = ftp_sendquote(conn, data->set.postquote);
  Curl_safefree(ftp->pathalloc);
  return result;
}